

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_parse_der
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  int iVar1;
  uchar *in_RCX;
  secp256k1_scalar *in_RDX;
  secp256k1_scalar *in_RSI;
  long in_RDI;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar *in_stack_ffffffffffffffc8;
  secp256k1_callback *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x174,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (secp256k1_scalar *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_scalar *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_sig_parse(in_RSI,in_RDX,in_RCX,(size_t)in_stack_ffffffffffffffd0);
    if (iVar1 == 0) {
      memset(in_RSI,0,0x40);
      local_4 = 0;
    }
    else {
      secp256k1_ecdsa_signature_save
                ((secp256k1_ecdsa_signature *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (secp256k1_scalar *)0x1028e5);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_signature_parse_der(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input != NULL);

    if (secp256k1_ecdsa_sig_parse(&r, &s, input, inputlen)) {
        secp256k1_ecdsa_signature_save(sig, &r, &s);
        return 1;
    } else {
        memset(sig, 0, sizeof(*sig));
        return 0;
    }
}